

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextSpecsOf.hpp
# Opt level: O1

void __thiscall
sciplot::TextSpecsOf<sciplot::TicsSpecs>::TextSpecsOf
          (TextSpecsOf<sciplot::TicsSpecs> *this,void **vtt)

{
  void *pvVar1;
  string local_50;
  
  pvVar1 = vtt[1];
  *(void **)&this->super_FontSpecsOf<sciplot::TicsSpecs> = pvVar1;
  *(void **)(&(this->super_FontSpecsOf<sciplot::TicsSpecs>).field_0x0 +
            *(long *)((long)pvVar1 + -0x28)) = vtt[2];
  (this->super_FontSpecsOf<sciplot::TicsSpecs>).m_fontname._M_dataplus._M_p =
       (pointer)&(this->super_FontSpecsOf<sciplot::TicsSpecs>).m_fontname.field_2;
  (this->super_FontSpecsOf<sciplot::TicsSpecs>).m_fontname._M_string_length = 0;
  (this->super_FontSpecsOf<sciplot::TicsSpecs>).m_fontname.field_2._M_local_buf[0] = '\0';
  (this->super_FontSpecsOf<sciplot::TicsSpecs>).m_fontsize._M_dataplus._M_p =
       (pointer)&(this->super_FontSpecsOf<sciplot::TicsSpecs>).m_fontsize.field_2;
  (this->super_FontSpecsOf<sciplot::TicsSpecs>).m_fontsize._M_string_length = 0;
  (this->super_FontSpecsOf<sciplot::TicsSpecs>).m_fontsize.field_2._M_local_buf[0] = '\0';
  pvVar1 = *vtt;
  *(void **)&this->super_FontSpecsOf<sciplot::TicsSpecs> = pvVar1;
  *(void **)(&(this->super_FontSpecsOf<sciplot::TicsSpecs>).field_0x0 +
            *(long *)((long)pvVar1 + -0x28)) = vtt[3];
  (this->m_color)._M_dataplus._M_p = (pointer)&(this->m_color).field_2;
  (this->m_color)._M_string_length = 0;
  (this->m_color).field_2._M_local_buf[0] = '\0';
  (this->m_enhanced)._M_dataplus._M_p = (pointer)&(this->m_enhanced).field_2;
  (this->m_enhanced)._M_string_length = 0;
  (this->m_enhanced).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&this->m_enhanced,0,(char *)0x0,0x18e493);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"#404040","");
  textColor(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TextSpecsOf<DerivedSpecs>::TextSpecsOf()
{
    enhanced(true);
    textColor(internal::DEFAULT_TEXTCOLOR);
}